

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O2

shared_ptr<mocker::detail::ReassociationImpl::Node> __thiscall
mocker::detail::ReassociationImpl::buildTrees
          (ReassociationImpl *this,shared_ptr<mocker::ir::Addr> *node,bool firstNode)

{
  int iVar1;
  BasicBlock *pBVar2;
  Def *pDVar3;
  bool bVar4;
  mapped_type *pmVar5;
  char in_CL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::detail::ReassociationImpl::Node> sVar6;
  undefined1 local_80 [16];
  shared_ptr<mocker::ir::ArithBinaryInst> binary;
  shared_ptr<mocker::ir::Reg> reg;
  Def def;
  shared_ptr<mocker::ir::IRInst> inst;
  
  std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>
            ((shared_ptr<mocker::ir::Addr> *)&def);
  if (CONCAT44(def.bbLabel._4_4_,(undefined4)def.bbLabel) == 0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&def.inst);
    ir::dycGlobalReg((shared_ptr<mocker::ir::Addr> *)&def);
    if (CONCAT44(def.bbLabel._4_4_,(undefined4)def.bbLabel) == 0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&def.inst);
      ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&reg);
      if (CONCAT44(reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                   reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_)
          == 0) {
        __assert_fail("reg",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                      ,0x41,
                      "std::shared_ptr<detail::ReassociationImpl::Node> mocker::detail::ReassociationImpl::buildTrees(const std::shared_ptr<ir::Addr> &, bool)"
                     );
      }
      bVar4 = isParameter((FunctionModule *)
                          (node->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi,
                          (string *)
                          (CONCAT44(reg.
                                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr._4_4_,
                                    reg.
                                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr._0_4_) + 8));
      if (bVar4) {
LAB_00164116:
        def.bbLabel._0_4_ = 2;
        std::
        make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                  ((Type *)this,(shared_ptr<mocker::ir::Reg> *)&def);
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(CONCAT44(reg.
                                           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr._4_4_,
                                           reg.
                                           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr._0_4_) + 8),".phi_nan");
        if (bVar4) goto LAB_00164116;
        if (in_CL == '\0') {
          bVar4 = isIn<std::unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>,std::shared_ptr<mocker::ir::Reg>>
                            ((unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
                              *)(node + 2),&reg);
          if (!bVar4) goto LAB_00164166;
          def.bbLabel._0_4_ = 0;
          std::
          make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                    ((Type *)this,(shared_ptr<mocker::ir::Reg> *)&def);
        }
        else {
LAB_00164166:
          pmVar5 = std::__detail::
                   _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::at((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)node[1].super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi,&reg);
          UseDefChain::Def::Def(&def,pmVar5);
          if ((_func_int **)CONCAT44(def.bbLabel._4_4_,(undefined4)def.bbLabel) ==
              ((node->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_Addr) {
            std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>,
                       &def.inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)
            ;
            ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>&>
                      ((ir *)&binary,
                       (shared_ptr<mocker::ir::IRInst> *)
                       &inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>);
            if (CONCAT44(binary.
                         super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._4_4_,
                         binary.
                         super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._0_4_) == 0) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&binary.
                          super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              ir::dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>&>
                        ((ir *)&binary,&inst);
              if (CONCAT44(binary.
                           super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr._4_4_,
                           binary.
                           super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr._0_4_) != 0) {
                if (*(int *)(CONCAT44(binary.
                                      super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr._4_4_,
                                      binary.
                                      super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr._0_4_) + 0x28) != 0) {
                  local_80._0_4_ = 2;
                  std::
                  make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                            ((Type *)this,(shared_ptr<mocker::ir::Reg> *)local_80);
                  goto LAB_00164392;
                }
                local_80._0_4_ = 5;
                std::
                make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                          ((Type *)this,(shared_ptr<mocker::ir::Reg> *)local_80);
                pBVar2 = this->bb;
                buildTrees((ReassociationImpl *)local_80,node,
                           (bool)((char)binary.
                                        super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._0_4_ + '0'));
                std::
                vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                          ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                            *)&(pBVar2->insts).
                               super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                               ._M_impl._M_node._M_size,
                           (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_80);
LAB_00164388:
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
                goto LAB_00164392;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&binary.
                          super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              ir::dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>&>((ir *)&binary,&inst);
              if (CONCAT44(binary.
                           super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr._4_4_,
                           binary.
                           super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr._0_4_) != 0) {
                local_80._0_4_ = 6;
                std::
                make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                          ((Type *)this,(shared_ptr<mocker::ir::Reg> *)local_80);
                pBVar2 = this->bb;
                buildTrees((ReassociationImpl *)local_80,node,
                           (bool)((char)binary.
                                        super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._0_4_ + '('));
                std::
                vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                          ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                            *)&(pBVar2->insts).
                               super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                               ._M_impl._M_node._M_size,
                           (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_80);
                goto LAB_00164388;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&binary.
                          super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              binary.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr._0_4_ = 2;
              std::
              make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                        ((Type *)this,(shared_ptr<mocker::ir::Reg> *)&binary);
            }
            else {
              iVar1 = *(int *)(CONCAT44(binary.
                                        super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._4_4_,
                                        binary.
                                        super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._0_4_) + 0x28);
              if (iVar1 - 5U < 2) {
                local_80._0_4_ = (iVar1 != 5) + 3;
                std::
                make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                          ((Type *)this,(shared_ptr<mocker::ir::Reg> *)local_80);
                pBVar2 = this->bb;
                buildTrees((ReassociationImpl *)local_80,node,
                           (bool)((char)binary.
                                        super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._0_4_ + '0'));
                std::
                vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                          ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                            *)&(pBVar2->insts).
                               super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                               ._M_impl._M_node._M_size,
                           (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_80);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
                pBVar2 = this->bb;
                buildTrees((ReassociationImpl *)local_80,node,
                           (bool)((char)binary.
                                        super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._0_4_ + '@'));
                std::
                vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                          ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                            *)&(pBVar2->insts).
                               super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                               ._M_impl._M_node._M_size,
                           (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_80);
                goto LAB_00164388;
              }
              local_80._0_4_ = 2;
              std::
              make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                        ((Type *)this,(shared_ptr<mocker::ir::Reg> *)local_80);
LAB_00164392:
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&binary.
                          super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          else {
            inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 2
            ;
            std::
            make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                      ((Type *)this,(shared_ptr<mocker::ir::Reg> *)&inst);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&def.inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
      pDVar3 = (Def *)&reg;
      goto LAB_001640b0;
    }
    reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 2;
    std::
    make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
              ((Type *)this,&reg);
  }
  else {
    reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
    std::
    make_shared<mocker::detail::ReassociationImpl::Node,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::IntLiteral>&>
              ((Type *)this,(shared_ptr<mocker::ir::IntLiteral> *)&reg);
  }
  pDVar3 = &def;
LAB_001640b0:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pDVar3->inst);
  sVar6.super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar6.super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<mocker::detail::ReassociationImpl::Node>)
         sVar6.
         super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<detail::ReassociationImpl::Node>
detail::ReassociationImpl::buildTrees(const std::shared_ptr<ir::Addr> &node,
                                      bool firstNode) {
  if (auto lit = ir::dyc<ir::IntLiteral>(node)) {
    return std::make_shared<Node>(Node::Literal, lit);
  }
  if (auto gReg = ir::dycGlobalReg(node)) {
    return std::make_shared<Node>(Node::Leaf, gReg);
  }

  auto reg = ir::dycLocalReg(node);
  assert(reg);
  if (isParameter(func, reg->getIdentifier()) ||
      reg->getIdentifier() == ".phi_nan") {
    return std::make_shared<Node>(Node::Leaf, reg);
  }

  if (!firstNode && isIn(roots, reg)) {
    return std::make_shared<Node>(Node::Root, reg);
  }

  auto def = useDef.getDef(reg);
  if (def.getBBLabel() != bb.getLabelID()) {
    return std::make_shared<Node>(Node::Leaf, reg);
  }

  auto inst = def.getInst();
  if (auto binary = ir::dyc<ir::ArithBinaryInst>(inst)) {
    if (binary->getOp() != ir::ArithBinaryInst::Add &&
        binary->getOp() != ir::ArithBinaryInst::Sub) {
      return std::make_shared<Node>(Node::Leaf, reg);
    }
    auto res = std::make_shared<Node>(
        binary->getOp() == ir::ArithBinaryInst::Add ? Node::Add : Node::Sub,
        reg);
    res->children.emplace_back(buildTrees(binary->getLhs(), false));
    res->children.emplace_back(buildTrees(binary->getRhs(), false));
    return res;
  }

  if (auto unary = ir::dyc<ir::ArithUnaryInst>(inst)) {
    if (unary->getOp() != ir::ArithUnaryInst::Neg)
      return std::make_shared<Node>(Node::Leaf, reg);
    auto res = std::make_shared<Node>(Node::Neg, reg);
    res->children.emplace_back(buildTrees(unary->getOperand(), false));
    return res;
  }

  if (auto assign = ir::dyc<ir::Assign>(inst)) {
    auto res = std::make_shared<Node>(Node::Assign, reg);
    res->children.emplace_back(buildTrees(assign->getOperand(), false));
    return res;
  }

  return std::make_shared<Node>(Node::Leaf, reg);
}